

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

bool __thiscall
cmInstallCommand::HandleDirectoryMode
          (cmInstallCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  bool bVar1;
  MessageLevel message_00;
  size_type sVar2;
  const_reference pvVar3;
  char *pcVar4;
  ostream *poVar5;
  cmInstallDirectoryGenerator *this_01;
  char *dir_permissions;
  char *component_00;
  char *literal_args_00;
  cmGlobalGenerator *this_02;
  undefined1 local_1ca0 [4];
  MessageLevel message;
  undefined1 local_1c80 [8];
  ostringstream e_16;
  allocator local_1b01;
  value_type local_1b00;
  string local_1ae0;
  undefined1 local_1ac0 [8];
  ostringstream e_15;
  string local_1948;
  undefined1 local_1928 [8];
  ostringstream e_14;
  string local_17b0;
  undefined1 local_1790 [8];
  ostringstream e_13;
  string local_1618;
  undefined1 local_15f8 [8];
  ostringstream e_12;
  undefined1 local_1480 [8];
  string regex_1;
  string regex;
  undefined1 local_1420 [8];
  ostringstream e_11;
  undefined1 local_12a8 [8];
  string dir;
  undefined1 local_1268 [8];
  ostringstream e_10;
  string local_10f0;
  undefined1 local_10d0 [8];
  ostringstream e_9;
  string local_f58;
  undefined1 local_f38 [8];
  ostringstream e_8;
  string local_dc0;
  undefined1 local_da0 [8];
  ostringstream e_7;
  string local_c28;
  undefined1 local_c08 [8];
  ostringstream e_6;
  string local_a90;
  undefined1 local_a70 [8];
  ostringstream e_5;
  string local_8f8;
  undefined1 local_8d8 [8];
  ostringstream e_4;
  string local_760;
  undefined1 local_740 [8];
  ostringstream e_3;
  string local_5c8;
  undefined1 local_5a8 [8];
  ostringstream e_2;
  string local_430;
  undefined1 local_410 [8];
  ostringstream e_1;
  string local_290;
  undefined1 local_270 [8];
  ostringstream e;
  uint local_f4;
  undefined1 local_f0 [4];
  uint i;
  string literal_args;
  string local_c0 [8];
  string component;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurations;
  string permissions_dir;
  string permissions_file;
  char *destination;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  bool message_never;
  bool optional;
  bool in_match_mode;
  Doing doing;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmInstallCommand *this_local;
  
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&destination);
  permissions_file.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)(permissions_dir.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             &configurations.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&component.field_2 + 8));
  std::__cxx11::string::string(local_c0,(string *)&this->DefaultComponentName);
  std::__cxx11::string::string((string *)local_f0);
  local_f4 = 1;
  do {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(args);
    if (sVar2 <= local_f4) {
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&destination);
      if ((bVar1) && (permissions_file.field_2._8_8_ != 0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1b00,"",&local_1b01);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&destination,&local_1b00);
        std::__cxx11::string::~string((string *)&local_1b00);
        std::allocator<char>::~allocator((allocator<char> *)&local_1b01);
      }
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&destination);
      if (bVar1) {
        this_local._7_1_ = 1;
      }
      else if (permissions_file.field_2._8_8_ == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c80);
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,0);
        poVar5 = std::operator<<((ostream *)local_1c80,(string *)pvVar3);
        std::operator<<(poVar5," given no DESTINATION!");
        std::__cxx11::ostringstream::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)local_1ca0);
        std::__cxx11::string::~string((string *)local_1ca0);
        this_local._7_1_ = 0;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c80);
      }
      else {
        message_00 = cmInstallGenerator::SelectMessageLevel
                               ((this->super_cmCommand).Makefile,
                                (bool)(dirs.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ & 1)
                               );
        this_00 = (this->super_cmCommand).Makefile;
        this_01 = (cmInstallDirectoryGenerator *)operator_new(0x138);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        dir_permissions = (char *)std::__cxx11::string::c_str();
        component_00 = (char *)std::__cxx11::string::c_str();
        literal_args_00 = (char *)std::__cxx11::string::c_str();
        cmInstallDirectoryGenerator::cmInstallDirectoryGenerator
                  (this_01,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&destination,(char *)permissions_file.field_2._8_8_,pcVar4,
                   dir_permissions,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&component.field_2 + 8),component_00,message_00,literal_args_00,
                   (bool)(dirs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ & 1));
        cmMakefile::AddInstallGenerator(this_00,(cmInstallGenerator *)this_01);
        this_02 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmGlobalGenerator::AddInstallComponent(this_02,pcVar4);
        this_local._7_1_ = 1;
      }
LAB_004d05e1:
      std::__cxx11::string::~string((string *)local_f0);
      std::__cxx11::string::~string(local_c0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&component.field_2 + 8));
      std::__cxx11::string::~string
                ((string *)
                 &configurations.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)(permissions_dir.field_2._M_local_buf + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&destination);
      return (bool)(this_local._7_1_ & 1);
    }
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,(ulong)local_f4);
    bVar1 = std::operator==(pvVar3,"DESTINATION");
    if (bVar1) {
      if ((dirs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_270);
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,0);
        poVar5 = std::operator<<((ostream *)local_270,(string *)pvVar3);
        poVar5 = std::operator<<(poVar5," does not allow \"");
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,(ulong)local_f4);
        poVar5 = std::operator<<(poVar5,(string *)pvVar3);
        std::operator<<(poVar5,"\" after PATTERN or REGEX.");
        std::__cxx11::ostringstream::str();
        cmCommand::SetError(&this->super_cmCommand,&local_290);
        std::__cxx11::string::~string((string *)&local_290);
        this_local._7_1_ = 0;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_270);
        goto LAB_004d05e1;
      }
      dirs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
    }
    else {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,(ulong)local_f4);
      bVar1 = std::operator==(pvVar3,"OPTIONAL");
      if (bVar1) {
        if ((dirs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](args,0);
          poVar5 = std::operator<<((ostream *)local_410,(string *)pvVar3);
          poVar5 = std::operator<<(poVar5," does not allow \"");
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](args,(ulong)local_f4);
          poVar5 = std::operator<<(poVar5,(string *)pvVar3);
          std::operator<<(poVar5,"\" after PATTERN or REGEX.");
          std::__cxx11::ostringstream::str();
          cmCommand::SetError(&this->super_cmCommand,&local_430);
          std::__cxx11::string::~string((string *)&local_430);
          this_local._7_1_ = 0;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_410);
          goto LAB_004d05e1;
        }
        dirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 1;
        dirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      }
      else {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,(ulong)local_f4);
        bVar1 = std::operator==(pvVar3,"MESSAGE_NEVER");
        if (bVar1) {
          if ((dirs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5a8);
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,0);
            poVar5 = std::operator<<((ostream *)local_5a8,(string *)pvVar3);
            poVar5 = std::operator<<(poVar5," does not allow \"");
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)local_f4);
            poVar5 = std::operator<<(poVar5,(string *)pvVar3);
            std::operator<<(poVar5,"\" after PATTERN or REGEX.");
            std::__cxx11::ostringstream::str();
            cmCommand::SetError(&this->super_cmCommand,&local_5c8);
            std::__cxx11::string::~string((string *)&local_5c8);
            this_local._7_1_ = 0;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5a8);
            goto LAB_004d05e1;
          }
          dirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ = 1;
          dirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        }
        else {
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](args,(ulong)local_f4);
          bVar1 = std::operator==(pvVar3,"PATTERN");
          if (bVar1) {
            dirs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 3;
            dirs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
          }
          else {
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)local_f4);
            bVar1 = std::operator==(pvVar3,"REGEX");
            if (bVar1) {
              dirs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 4;
              dirs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
            }
            else {
              pvVar3 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](args,(ulong)local_f4);
              bVar1 = std::operator==(pvVar3,"EXCLUDE");
              if (bVar1) {
                if ((((dirs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) ||
                    (dirs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 3)) ||
                   (dirs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 4)) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_740);
                  pvVar3 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[](args,0);
                  poVar5 = std::operator<<((ostream *)local_740,(string *)pvVar3);
                  poVar5 = std::operator<<(poVar5," does not allow \"");
                  pvVar3 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[](args,(ulong)local_f4);
                  poVar5 = std::operator<<(poVar5,(string *)pvVar3);
                  std::operator<<(poVar5,"\" before a PATTERN or REGEX is given.");
                  std::__cxx11::ostringstream::str();
                  cmCommand::SetError(&this->super_cmCommand,&local_760);
                  std::__cxx11::string::~string((string *)&local_760);
                  this_local._7_1_ = 0;
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_740);
                  goto LAB_004d05e1;
                }
                std::__cxx11::string::operator+=((string *)local_f0," EXCLUDE");
                dirs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
              }
              else {
                pvVar3 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](args,(ulong)local_f4);
                bVar1 = std::operator==(pvVar3,"PERMISSIONS");
                if (bVar1) {
                  if ((dirs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8d8);
                    pvVar3 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[](args,0);
                    poVar5 = std::operator<<((ostream *)local_8d8,(string *)pvVar3);
                    poVar5 = std::operator<<(poVar5," does not allow \"");
                    pvVar3 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[](args,(ulong)local_f4);
                    poVar5 = std::operator<<(poVar5,(string *)pvVar3);
                    std::operator<<(poVar5,"\" before a PATTERN or REGEX is given.");
                    std::__cxx11::ostringstream::str();
                    cmCommand::SetError(&this->super_cmCommand,&local_8f8);
                    std::__cxx11::string::~string((string *)&local_8f8);
                    this_local._7_1_ = 0;
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8d8);
                    goto LAB_004d05e1;
                  }
                  std::__cxx11::string::operator+=((string *)local_f0," PERMISSIONS");
                  dirs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 7;
                }
                else {
                  pvVar3 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[](args,(ulong)local_f4);
                  bVar1 = std::operator==(pvVar3,"FILE_PERMISSIONS");
                  if (bVar1) {
                    if ((dirs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a70);
                      pvVar3 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::operator[](args,0);
                      poVar5 = std::operator<<((ostream *)local_a70,(string *)pvVar3);
                      poVar5 = std::operator<<(poVar5," does not allow \"");
                      pvVar3 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::operator[](args,(ulong)local_f4);
                      poVar5 = std::operator<<(poVar5,(string *)pvVar3);
                      std::operator<<(poVar5,"\" after PATTERN or REGEX.");
                      std::__cxx11::ostringstream::str();
                      cmCommand::SetError(&this->super_cmCommand,&local_a90);
                      std::__cxx11::string::~string((string *)&local_a90);
                      this_local._7_1_ = 0;
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a70);
                      goto LAB_004d05e1;
                    }
                    dirs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 5;
                  }
                  else {
                    pvVar3 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[](args,(ulong)local_f4);
                    bVar1 = std::operator==(pvVar3,"DIRECTORY_PERMISSIONS");
                    if (bVar1) {
                      if ((dirs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c08);
                        pvVar3 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::operator[](args,0);
                        poVar5 = std::operator<<((ostream *)local_c08,(string *)pvVar3);
                        poVar5 = std::operator<<(poVar5," does not allow \"");
                        pvVar3 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::operator[](args,(ulong)local_f4);
                        poVar5 = std::operator<<(poVar5,(string *)pvVar3);
                        std::operator<<(poVar5,"\" after PATTERN or REGEX.");
                        std::__cxx11::ostringstream::str();
                        cmCommand::SetError(&this->super_cmCommand,&local_c28);
                        std::__cxx11::string::~string((string *)&local_c28);
                        this_local._7_1_ = 0;
                        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c08);
                        goto LAB_004d05e1;
                      }
                      dirs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 6;
                    }
                    else {
                      pvVar3 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::operator[](args,(ulong)local_f4);
                      bVar1 = std::operator==(pvVar3,"USE_SOURCE_PERMISSIONS");
                      if (bVar1) {
                        if ((dirs.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_da0);
                          pvVar3 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::operator[](args,0);
                          poVar5 = std::operator<<((ostream *)local_da0,(string *)pvVar3);
                          poVar5 = std::operator<<(poVar5," does not allow \"");
                          pvVar3 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::operator[](args,(ulong)local_f4);
                          poVar5 = std::operator<<(poVar5,(string *)pvVar3);
                          std::operator<<(poVar5,"\" after PATTERN or REGEX.");
                          std::__cxx11::ostringstream::str();
                          cmCommand::SetError(&this->super_cmCommand,&local_dc0);
                          std::__cxx11::string::~string((string *)&local_dc0);
                          this_local._7_1_ = 0;
                          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_da0);
                          goto LAB_004d05e1;
                        }
                        std::__cxx11::string::operator+=
                                  ((string *)local_f0," USE_SOURCE_PERMISSIONS");
                        dirs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                      }
                      else {
                        pvVar3 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::operator[](args,(ulong)local_f4);
                        bVar1 = std::operator==(pvVar3,"FILES_MATCHING");
                        if (bVar1) {
                          if ((dirs.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
                            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f38);
                            pvVar3 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::operator[](args,0);
                            poVar5 = std::operator<<((ostream *)local_f38,(string *)pvVar3);
                            poVar5 = std::operator<<(poVar5," does not allow \"");
                            pvVar3 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::operator[](args,(ulong)local_f4);
                            poVar5 = std::operator<<(poVar5,(string *)pvVar3);
                            std::operator<<(poVar5,"\" after PATTERN or REGEX.");
                            std::__cxx11::ostringstream::str();
                            cmCommand::SetError(&this->super_cmCommand,&local_f58);
                            std::__cxx11::string::~string((string *)&local_f58);
                            this_local._7_1_ = 0;
                            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f38);
                            goto LAB_004d05e1;
                          }
                          std::__cxx11::string::operator+=((string *)local_f0," FILES_MATCHING");
                          dirs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                        }
                        else {
                          pvVar3 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::operator[](args,(ulong)local_f4);
                          bVar1 = std::operator==(pvVar3,"CONFIGURATIONS");
                          if (bVar1) {
                            if ((dirs.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0)
                            {
                              std::__cxx11::ostringstream::ostringstream
                                        ((ostringstream *)local_10d0);
                              pvVar3 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[](args,0);
                              poVar5 = std::operator<<((ostream *)local_10d0,(string *)pvVar3);
                              poVar5 = std::operator<<(poVar5," does not allow \"");
                              pvVar3 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[](args,(ulong)local_f4);
                              poVar5 = std::operator<<(poVar5,(string *)pvVar3);
                              std::operator<<(poVar5,"\" after PATTERN or REGEX.");
                              std::__cxx11::ostringstream::str();
                              cmCommand::SetError(&this->super_cmCommand,&local_10f0);
                              std::__cxx11::string::~string((string *)&local_10f0);
                              this_local._7_1_ = 0;
                              std::__cxx11::ostringstream::~ostringstream
                                        ((ostringstream *)local_10d0);
                              goto LAB_004d05e1;
                            }
                            dirs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 8;
                          }
                          else {
                            pvVar3 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::operator[](args,(ulong)local_f4);
                            bVar1 = std::operator==(pvVar3,"COMPONENT");
                            if (bVar1) {
                              if ((dirs.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) !=
                                  0) {
                                std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)local_1268);
                                pvVar3 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[](args,0);
                                poVar5 = std::operator<<((ostream *)local_1268,(string *)pvVar3);
                                poVar5 = std::operator<<(poVar5," does not allow \"");
                                pvVar3 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[](args,(ulong)local_f4);
                                poVar5 = std::operator<<(poVar5,(string *)pvVar3);
                                std::operator<<(poVar5,"\" after PATTERN or REGEX.");
                                std::__cxx11::ostringstream::str();
                                cmCommand::SetError(&this->super_cmCommand,
                                                    (string *)((long)&dir.field_2 + 8));
                                std::__cxx11::string::~string
                                          ((string *)(dir.field_2._M_local_buf + 8));
                                this_local._7_1_ = 0;
                                std::__cxx11::ostringstream::~ostringstream
                                          ((ostringstream *)local_1268);
                                goto LAB_004d05e1;
                              }
                              dirs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 9;
                            }
                            else if (dirs.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 1)
                            {
                              pvVar3 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[](args,(ulong)local_f4);
                              std::__cxx11::string::string((string *)local_12a8,(string *)pvVar3);
                              pcVar4 = (char *)std::__cxx11::string::c_str();
                              bVar1 = cmsys::SystemTools::FileIsFullPath(pcVar4);
                              if (!bVar1) {
                                pcVar4 = cmMakefile::GetCurrentSourceDirectory
                                                   ((this->super_cmCommand).Makefile);
                                std::__cxx11::string::operator=((string *)local_12a8,pcVar4);
                                std::__cxx11::string::operator+=((string *)local_12a8,"/");
                                pvVar3 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[](args,(ulong)local_f4);
                                std::__cxx11::string::operator+=
                                          ((string *)local_12a8,(string *)pvVar3);
                              }
                              pcVar4 = (char *)std::__cxx11::string::c_str();
                              bVar1 = cmsys::SystemTools::FileExists(pcVar4);
                              if ((!bVar1) ||
                                 (bVar1 = cmsys::SystemTools::FileIsDirectory((string *)local_12a8),
                                 bVar1)) {
                                std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&destination,(value_type *)local_12a8);
                                bVar1 = false;
                              }
                              else {
                                std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)local_1420);
                                pvVar3 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[](args,0);
                                poVar5 = std::operator<<((ostream *)local_1420,(string *)pvVar3);
                                poVar5 = std::operator<<(poVar5," given non-directory \"");
                                pvVar3 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[](args,(ulong)local_f4);
                                poVar5 = std::operator<<(poVar5,(string *)pvVar3);
                                std::operator<<(poVar5,"\" to install.");
                                std::__cxx11::ostringstream::str();
                                cmCommand::SetError(&this->super_cmCommand,
                                                    (string *)((long)&regex.field_2 + 8));
                                std::__cxx11::string::~string
                                          ((string *)(regex.field_2._M_local_buf + 8));
                                this_local._7_1_ = 0;
                                bVar1 = true;
                                std::__cxx11::ostringstream::~ostringstream
                                          ((ostringstream *)local_1420);
                              }
                              std::__cxx11::string::~string((string *)local_12a8);
                              if (bVar1) goto LAB_004d05e1;
                            }
                            else if (dirs.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 8)
                            {
                              pvVar3 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[](args,(ulong)local_f4);
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)((long)&component.field_2 + 8),pvVar3);
                            }
                            else if (dirs.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 2)
                            {
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::operator[](args,(ulong)local_f4);
                              permissions_file.field_2._8_8_ = std::__cxx11::string::c_str();
                              dirs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                            }
                            else if (dirs.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 3)
                            {
                              std::__cxx11::string::operator+=((string *)local_f0," REGEX \"/");
                              pvVar3 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[](args,(ulong)local_f4);
                              cmsys::Glob::PatternToRegex
                                        ((string *)((long)&regex_1.field_2 + 8),pvVar3,false,false);
                              cmsys::SystemTools::ReplaceString
                                        ((string *)((long)&regex_1.field_2 + 8),"\\","\\\\");
                              std::__cxx11::string::operator+=
                                        ((string *)local_f0,
                                         (string *)(regex_1.field_2._M_local_buf + 8));
                              std::__cxx11::string::operator+=((string *)local_f0,"$\"");
                              dirs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                              std::__cxx11::string::~string
                                        ((string *)(regex_1.field_2._M_local_buf + 8));
                            }
                            else if (dirs.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 4)
                            {
                              std::__cxx11::string::operator+=((string *)local_f0," REGEX \"");
                              pvVar3 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[](args,(ulong)local_f4);
                              std::__cxx11::string::string((string *)local_1480,(string *)pvVar3);
                              cmsys::SystemTools::ReplaceString((string *)local_1480,"\\","\\\\");
                              std::__cxx11::string::operator+=
                                        ((string *)local_f0,(string *)local_1480);
                              std::__cxx11::string::operator+=((string *)local_f0,"\"");
                              dirs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                              std::__cxx11::string::~string((string *)local_1480);
                            }
                            else if (dirs.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 9)
                            {
                              pvVar3 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[](args,(ulong)local_f4);
                              std::__cxx11::string::operator=(local_c0,(string *)pvVar3);
                              dirs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                            }
                            else if (dirs.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 5)
                            {
                              pvVar3 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[](args,(ulong)local_f4);
                              bVar1 = cmInstallCommandArguments::CheckPermissions
                                                (pvVar3,(string *)
                                                        ((long)&permissions_dir.field_2 + 8));
                              if (!bVar1) {
                                std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)local_15f8);
                                pvVar3 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[](args,0);
                                poVar5 = std::operator<<((ostream *)local_15f8,(string *)pvVar3);
                                poVar5 = std::operator<<(poVar5," given invalid file permission \"")
                                ;
                                pvVar3 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[](args,(ulong)local_f4);
                                poVar5 = std::operator<<(poVar5,(string *)pvVar3);
                                std::operator<<(poVar5,"\".");
                                std::__cxx11::ostringstream::str();
                                cmCommand::SetError(&this->super_cmCommand,&local_1618);
                                std::__cxx11::string::~string((string *)&local_1618);
                                this_local._7_1_ = 0;
                                std::__cxx11::ostringstream::~ostringstream
                                          ((ostringstream *)local_15f8);
                                goto LAB_004d05e1;
                              }
                            }
                            else if (dirs.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 6)
                            {
                              pvVar3 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[](args,(ulong)local_f4);
                              bVar1 = cmInstallCommandArguments::CheckPermissions
                                                (pvVar3,(string *)
                                                        &configurations.
                                                                                                                  
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                );
                              if (!bVar1) {
                                std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)local_1790);
                                pvVar3 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[](args,0);
                                poVar5 = std::operator<<((ostream *)local_1790,(string *)pvVar3);
                                poVar5 = std::operator<<(poVar5,
                                                  " given invalid directory permission \"");
                                pvVar3 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[](args,(ulong)local_f4);
                                poVar5 = std::operator<<(poVar5,(string *)pvVar3);
                                std::operator<<(poVar5,"\".");
                                std::__cxx11::ostringstream::str();
                                cmCommand::SetError(&this->super_cmCommand,&local_17b0);
                                std::__cxx11::string::~string((string *)&local_17b0);
                                this_local._7_1_ = 0;
                                std::__cxx11::ostringstream::~ostringstream
                                          ((ostringstream *)local_1790);
                                goto LAB_004d05e1;
                              }
                            }
                            else {
                              if (dirs.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 7) {
                                std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)local_1ac0);
                                pvVar3 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[](args,0);
                                poVar5 = std::operator<<((ostream *)local_1ac0,(string *)pvVar3);
                                poVar5 = std::operator<<(poVar5," given unknown argument \"");
                                pvVar3 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[](args,(ulong)local_f4);
                                poVar5 = std::operator<<(poVar5,(string *)pvVar3);
                                std::operator<<(poVar5,"\".");
                                std::__cxx11::ostringstream::str();
                                cmCommand::SetError(&this->super_cmCommand,&local_1ae0);
                                std::__cxx11::string::~string((string *)&local_1ae0);
                                this_local._7_1_ = 0;
                                std::__cxx11::ostringstream::~ostringstream
                                          ((ostringstream *)local_1ac0);
                                goto LAB_004d05e1;
                              }
                              pvVar3 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[](args,(ulong)local_f4);
                              bVar1 = cmInstallCommandArguments::CheckPermissions
                                                (pvVar3,(string *)local_f0);
                              if (!bVar1) {
                                std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)local_1928);
                                pvVar3 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[](args,0);
                                poVar5 = std::operator<<((ostream *)local_1928,(string *)pvVar3);
                                poVar5 = std::operator<<(poVar5," given invalid permission \"");
                                pvVar3 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[](args,(ulong)local_f4);
                                poVar5 = std::operator<<(poVar5,(string *)pvVar3);
                                std::operator<<(poVar5,"\".");
                                std::__cxx11::ostringstream::str();
                                cmCommand::SetError(&this->super_cmCommand,&local_1948);
                                std::__cxx11::string::~string((string *)&local_1948);
                                this_local._7_1_ = 0;
                                std::__cxx11::ostringstream::~ostringstream
                                          ((ostringstream *)local_1928);
                                goto LAB_004d05e1;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_f4 = local_f4 + 1;
  } while( true );
}

Assistant:

bool
cmInstallCommand::HandleDirectoryMode(std::vector<std::string> const& args)
{
  enum Doing { DoingNone, DoingDirs, DoingDestination, DoingPattern,
               DoingRegex, DoingPermsFile, DoingPermsDir, DoingPermsMatch,
               DoingConfigurations, DoingComponent };
  Doing doing = DoingDirs;
  bool in_match_mode = false;
  bool optional = false;
  bool message_never = false;
  std::vector<std::string> dirs;
  const char* destination = 0;
  std::string permissions_file;
  std::string permissions_dir;
  std::vector<std::string> configurations;
  std::string component = this->DefaultComponentName;
  std::string literal_args;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    if(args[i] == "DESTINATION")
      {
      if(in_match_mode)
        {
        std::ostringstream e;
        e << args[0] << " does not allow \""
          << args[i] << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
        }

      // Switch to setting the destination property.
      doing = DoingDestination;
      }
    else if(args[i] == "OPTIONAL")
      {
      if(in_match_mode)
        {
        std::ostringstream e;
        e << args[0] << " does not allow \""
          << args[i] << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
        }

      // Mark the rule as optional.
      optional = true;
      doing = DoingNone;
      }
    else if(args[i] == "MESSAGE_NEVER")
      {
      if(in_match_mode)
        {
        std::ostringstream e;
        e << args[0] << " does not allow \""
          << args[i] << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
        }

      // Mark the rule as quiet.
      message_never = true;
      doing = DoingNone;
      }
    else if(args[i] == "PATTERN")
      {
      // Switch to a new pattern match rule.
      doing = DoingPattern;
      in_match_mode = true;
      }
    else if(args[i] == "REGEX")
      {
      // Switch to a new regex match rule.
      doing = DoingRegex;
      in_match_mode = true;
      }
    else if(args[i] == "EXCLUDE")
      {
      // Add this property to the current match rule.
      if(!in_match_mode || doing == DoingPattern || doing == DoingRegex)
        {
        std::ostringstream e;
        e << args[0] << " does not allow \""
          << args[i] << "\" before a PATTERN or REGEX is given.";
        this->SetError(e.str());
        return false;
        }
      literal_args += " EXCLUDE";
      doing = DoingNone;
      }
    else if(args[i] == "PERMISSIONS")
      {
      if(!in_match_mode)
        {
        std::ostringstream e;
        e << args[0] << " does not allow \""
          << args[i] << "\" before a PATTERN or REGEX is given.";
        this->SetError(e.str());
        return false;
        }

      // Switch to setting the current match permissions property.
      literal_args += " PERMISSIONS";
      doing = DoingPermsMatch;
      }
    else if(args[i] == "FILE_PERMISSIONS")
      {
      if(in_match_mode)
        {
        std::ostringstream e;
        e << args[0] << " does not allow \""
          << args[i] << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
        }

      // Switch to setting the file permissions property.
      doing = DoingPermsFile;
      }
    else if(args[i] == "DIRECTORY_PERMISSIONS")
      {
      if(in_match_mode)
        {
        std::ostringstream e;
        e << args[0] << " does not allow \""
          << args[i] << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
        }

      // Switch to setting the directory permissions property.
      doing = DoingPermsDir;
      }
    else if(args[i] == "USE_SOURCE_PERMISSIONS")
      {
      if(in_match_mode)
        {
        std::ostringstream e;
        e << args[0] << " does not allow \""
          << args[i] << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
        }

      // Add this option literally.
      literal_args += " USE_SOURCE_PERMISSIONS";
      doing = DoingNone;
      }
    else if(args[i] == "FILES_MATCHING")
      {
      if(in_match_mode)
        {
        std::ostringstream e;
        e << args[0] << " does not allow \""
          << args[i] << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
        }

      // Add this option literally.
      literal_args += " FILES_MATCHING";
      doing = DoingNone;
      }
    else if(args[i] == "CONFIGURATIONS")
      {
      if(in_match_mode)
        {
        std::ostringstream e;
        e << args[0] << " does not allow \""
          << args[i] << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
        }

      // Switch to setting the configurations property.
      doing = DoingConfigurations;
      }
    else if(args[i] == "COMPONENT")
      {
      if(in_match_mode)
        {
        std::ostringstream e;
        e << args[0] << " does not allow \""
          << args[i] << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
        }

      // Switch to setting the component property.
      doing = DoingComponent;
      }
    else if(doing == DoingDirs)
      {
      // Convert this directory to a full path.
      std::string dir = args[i];
      if(!cmSystemTools::FileIsFullPath(dir.c_str()))
        {
        dir = this->Makefile->GetCurrentSourceDirectory();
        dir += "/";
        dir += args[i];
        }

      // Make sure the name is a directory.
      if(cmSystemTools::FileExists(dir.c_str()) &&
         !cmSystemTools::FileIsDirectory(dir))
        {
        std::ostringstream e;
        e << args[0] << " given non-directory \""
          << args[i] << "\" to install.";
        this->SetError(e.str());
        return false;
        }

      // Store the directory for installation.
      dirs.push_back(dir);
      }
    else if(doing == DoingConfigurations)
      {
      configurations.push_back(args[i]);
      }
    else if(doing == DoingDestination)
      {
      destination = args[i].c_str();
      doing = DoingNone;
      }
    else if(doing == DoingPattern)
      {
      // Convert the pattern to a regular expression.  Require a
      // leading slash and trailing end-of-string in the matched
      // string to make sure the pattern matches only whole file
      // names.
      literal_args += " REGEX \"/";
      std::string regex = cmsys::Glob::PatternToRegex(args[i], false);
      cmSystemTools::ReplaceString(regex, "\\", "\\\\");
      literal_args += regex;
      literal_args += "$\"";
      doing = DoingNone;
      }
    else if(doing == DoingRegex)
      {
      literal_args += " REGEX \"";
    // Match rules are case-insensitive on some platforms.
#if defined(_WIN32) || defined(__APPLE__) || defined(__CYGWIN__)
      std::string regex = cmSystemTools::LowerCase(args[i]);
#else
      std::string regex = args[i];
#endif
      cmSystemTools::ReplaceString(regex, "\\", "\\\\");
      literal_args += regex;
      literal_args += "\"";
      doing = DoingNone;
      }
    else if(doing == DoingComponent)
      {
      component = args[i];
      doing = DoingNone;
      }
    else if(doing == DoingPermsFile)
     {
     // Check the requested permission.
     if(!cmInstallCommandArguments::CheckPermissions(args[i],permissions_file))
        {
        std::ostringstream e;
        e << args[0] << " given invalid file permission \""
          << args[i] << "\".";
        this->SetError(e.str());
        return false;
        }
      }
    else if(doing == DoingPermsDir)
      {
      // Check the requested permission.
      if(!cmInstallCommandArguments::CheckPermissions(args[i],permissions_dir))
        {
        std::ostringstream e;
        e << args[0] << " given invalid directory permission \""
          << args[i] << "\".";
        this->SetError(e.str());
        return false;
        }
      }
    else if(doing == DoingPermsMatch)
      {
      // Check the requested permission.
      if(!cmInstallCommandArguments::CheckPermissions(args[i], literal_args))
        {
        std::ostringstream e;
        e << args[0] << " given invalid permission \""
          << args[i] << "\".";
        this->SetError(e.str());
        return false;
        }
      }
    else
      {
      // Unknown argument.
      std::ostringstream e;
      e << args[0] << " given unknown argument \"" << args[i] << "\".";
      this->SetError(e.str());
      return false;
      }
    }

  // Support installing an empty directory.
  if(dirs.empty() && destination)
    {
    dirs.push_back("");
    }

  // Check if there is something to do.
  if(dirs.empty())
    {
    return true;
    }
  if(!destination)
    {
    // A destination is required.
    std::ostringstream e;
    e << args[0] << " given no DESTINATION!";
    this->SetError(e.str());
    return false;
    }

  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(this->Makefile, message_never);

  // Create the directory install generator.
  this->Makefile->AddInstallGenerator(
    new cmInstallDirectoryGenerator(dirs, destination,
                                    permissions_file.c_str(),
                                    permissions_dir.c_str(),
                                    configurations,
                                    component.c_str(),
                                    message,
                                    literal_args.c_str(),
                                    optional));

  // Tell the global generator about any installation component names
  // specified.
  this->Makefile->GetGlobalGenerator()
    ->AddInstallComponent(component.c_str());

  return true;
}